

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void pnga_lock(Integer mutex)

{
  if (GAnproc == 1) {
    return;
  }
  if ((long)(ulong)(uint)num_mutexes < mutex) {
    pnga_error("invalid mutex",mutex);
  }
  ARMCI_Lock(num_mutexes % chunk_mutex,num_mutexes / chunk_mutex + -1);
  return;
}

Assistant:

void pnga_lock(Integer mutex)
{
int m,p;

   if(GAnproc == 1) return;
   if(num_mutexes< mutex)pnga_error("invalid mutex",mutex);

   p = num_mutexes/chunk_mutex -1;
   m = num_mutexes%chunk_mutex;

   ARMCI_Lock(m,p);
}